

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTcEmbedBuilderSgl::add_segment(CTcEmbedBuilderSgl *this,CTcPrsNode *cur)

{
  CTcPrsNode *pCVar1;
  _func_int **pp_Var2;
  CTcConstVal cval;
  CTcConstVal local_40;
  
  if ((G_tok->curtok_).text_len_ != 0) {
    local_40.typ_ = TC_CVT_UNK;
    local_40._32_1_ = local_40._32_1_ & 0xfe;
    CTcConstVal::set_sstr(&local_40,&G_tok->curtok_);
    pCVar1 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x18);
    pp_Var2 = (_func_int **)CTcPrsMem::alloc(G_prsmem,0x30);
    *pp_Var2 = (_func_int *)&PTR___cxa_pure_virtual_00316ce0;
    *(undefined4 *)(pp_Var2 + 1) = 0;
    *(byte *)(pp_Var2 + 5) = *(byte *)(pp_Var2 + 5) & 0xfe;
    pp_Var2[1] = (_func_int *)CONCAT44(local_40._4_4_,local_40.typ_);
    pp_Var2[2] = (_func_int *)local_40.val_.intval_;
    *(undefined1 *)(pp_Var2 + 5) = local_40._32_1_;
    pp_Var2[3] = (_func_int *)local_40.val_.floatval_.len_;
    pp_Var2[4] = (_func_int *)local_40.val_._16_8_;
    *pp_Var2 = (_func_int *)&PTR_gen_code_0031c798;
    pCVar1[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)cur;
    pCVar1[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var2;
    (pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031e350;
    cur = pCVar1;
  }
  return cur;
}

Assistant:

virtual CTcPrsNode *add_segment(CTcPrsNode *cur)
    {        
        /* 
         *   Add the next string segment.  We can omit it if it's zero
         *   length, as this will add nothing to the result.  
         */
        if (G_tok->getcur()->get_text_len() != 0)
        {
            CTcConstVal cval;
            cval.set_sstr(G_tok->getcur());
            cur = new CTPNAdd(cur, new CTPNConst(&cval));
        }
        
        /* return the new combined node */
        return cur;
    }